

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase615::run(TestCase615 *this)

{
  Builder reader_00;
  Builder reader_01;
  Reader reader_02;
  Reader reader_03;
  undefined1 uVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  initializer_list<unsigned_char> expected;
  initializer_list<unsigned_short> expected_00;
  initializer_list<unsigned_char> expected_01;
  initializer_list<unsigned_short> expected_02;
  Fault f_1;
  Reader reader;
  Builder root;
  Builder l;
  MallocMessageBuilder builder;
  uint local_3b4;
  undefined2 local_3b0;
  uint local_3ac;
  StructReader local_3a8;
  undefined1 local_378 [12];
  undefined4 uStack_36c;
  WirePointer *local_368;
  WirePointer *local_360;
  StructPointerCount local_354;
  ListElementCount local_350;
  StructBuilder local_348;
  NullableValue<kj::Exception> local_318;
  ListBuilder local_1b0;
  ListBuilder local_188;
  ListReader local_160;
  ListReader local_130;
  MallocMessageBuilder local_100;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_100,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)local_378,&local_100.super_MessageBuilder);
  local_318.field_1.value.ownFile.content.size_ = (size_t)local_368;
  local_318._0_8_ = local_378._0_8_;
  local_318.field_1.value.ownFile.content.ptr = (char *)stack0xfffffffffffffc90;
  PointerBuilder::initStruct(&local_348,(PointerBuilder *)&local_318,(StructSize)0x10000);
  local_3a8.segment = (SegmentReader *)CONCAT26(local_3a8.segment._6_2_,0x380022000c);
  local_378._0_8_ = local_348.segment;
  stack0xfffffffffffffc90 = &(local_348.capTable)->super_CapTableReader;
  local_368 = local_348.pointers;
  PointerBuilder::initList((ListBuilder *)&local_318,(PointerBuilder *)local_378,TWO_BYTES,3);
  uVar2 = 0;
  lVar4 = 0;
  do {
    *(undefined2 *)(local_318.field_1.value.ownFile.content.size_ + (uVar2 >> 3)) =
         *(undefined2 *)((long)&local_3a8.segment + lVar4);
    lVar4 = lVar4 + 2;
    uVar2 = uVar2 + (uint)local_318.field_1._20_4_;
  } while (lVar4 != 6);
  local_318._0_8_ = local_348.segment;
  local_318.field_1.value.ownFile.content.ptr = (char *)local_348.capTable;
  local_318.field_1.value.ownFile.content.size_ = (size_t)local_348.pointers;
  PointerBuilder::getList(&local_188,(PointerBuilder *)&local_318,BYTE,(word *)0x0);
  local_318._0_3_ = 0x38220c;
  reader_00.builder.capTable = local_188.capTable;
  reader_00.builder.segment = local_188.segment;
  reader_00.builder.ptr = local_188.ptr;
  reader_00.builder.elementCount = local_188.elementCount;
  reader_00.builder.step = local_188.step;
  reader_00.builder.structDataSize = local_188.structDataSize;
  reader_00.builder.structPointerCount = local_188.structPointerCount;
  reader_00.builder.elementSize = local_188.elementSize;
  reader_00.builder._39_1_ = local_188._39_1_;
  expected._M_len = 3;
  expected._M_array = &local_318.isSet;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_00,expected);
  local_378._0_8_ = local_348.segment;
  stack0xfffffffffffffc90 = &(local_348.capTable)->super_CapTableReader;
  local_368 = local_348.pointers;
  PointerBuilder::getStructList
            ((ListBuilder *)&local_318,(PointerBuilder *)local_378,(StructSize)0x1,(word *)0x0);
  if (local_318.field_1._16_4_ != 3) {
    local_3a8.segment = (SegmentReader *)CONCAT44(local_3a8.segment._4_4_,3);
    local_3b4 = local_318.field_1._16_4_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)local_378,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x271,FAILED,"(3u) == (l.size())","3u, l.size()",(uint *)&local_3a8,&local_3b4);
    kj::_::Debug::Fault::fatal((Fault *)local_378);
  }
  ListBuilder::getStructElement((StructBuilder *)local_378,(ListBuilder *)&local_318,0);
  if (((char)(local_368->offsetAndKind).value != '\f') && (kj::_::Debug::minSeverity < 3)) {
    local_3a8.segment = (SegmentReader *)CONCAT44(local_3a8.segment._4_4_,0xc);
    ListBuilder::getStructElement((StructBuilder *)local_378,(ListBuilder *)&local_318,0);
    local_3b4 = CONCAT31(local_3b4._1_3_,(char)(local_368->offsetAndKind).value);
    kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x272,ERROR,"\"failed: expected \" \"(12u) == (l[0].getF())\", 12u, l[0].getF()",
               (char (*) [40])"failed: expected (12u) == (l[0].getF())",(uint *)&local_3a8,
               (uchar *)&local_3b4);
  }
  ListBuilder::getStructElement((StructBuilder *)local_378,(ListBuilder *)&local_318,1);
  if (((char)(local_368->offsetAndKind).value != '\"') && (kj::_::Debug::minSeverity < 3)) {
    local_3a8.segment = (SegmentReader *)CONCAT44(local_3a8.segment._4_4_,0x22);
    ListBuilder::getStructElement((StructBuilder *)local_378,(ListBuilder *)&local_318,1);
    local_3b4 = CONCAT31(local_3b4._1_3_,(char)(local_368->offsetAndKind).value);
    kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x273,ERROR,"\"failed: expected \" \"(34u) == (l[1].getF())\", 34u, l[1].getF()",
               (char (*) [40])"failed: expected (34u) == (l[1].getF())",(uint *)&local_3a8,
               (uchar *)&local_3b4);
  }
  ListBuilder::getStructElement((StructBuilder *)local_378,(ListBuilder *)&local_318,2);
  if (((char)(local_368->offsetAndKind).value != '8') && (kj::_::Debug::minSeverity < 3)) {
    local_3a8.segment = (SegmentReader *)CONCAT44(local_3a8.segment._4_4_,0x38);
    ListBuilder::getStructElement((StructBuilder *)local_378,(ListBuilder *)&local_318,2);
    local_3b4 = CONCAT31(local_3b4._1_3_,(char)(local_368->offsetAndKind).value);
    kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x274,ERROR,"\"failed: expected \" \"(56u) == (l[2].getF())\", 56u, l[2].getF()",
               (char (*) [40])"failed: expected (56u) == (l[2].getF())",(uint *)&local_3a8,
               (uchar *)&local_3b4);
  }
  local_318._0_8_ = local_348.segment;
  local_318.field_1.value.ownFile.content.ptr = (char *)local_348.capTable;
  local_318.field_1.value.ownFile.content.size_ = (size_t)local_348.pointers;
  PointerBuilder::getList(&local_1b0,(PointerBuilder *)&local_318,TWO_BYTES,(word *)0x0);
  local_318._0_6_ = 0x380022000c;
  reader_01.builder.capTable = local_1b0.capTable;
  reader_01.builder.segment = local_1b0.segment;
  reader_01.builder.ptr = local_1b0.ptr;
  reader_01.builder.elementCount = local_1b0.elementCount;
  reader_01.builder.step = local_1b0.step;
  reader_01.builder.structDataSize = local_1b0.structDataSize;
  reader_01.builder.structPointerCount = local_1b0.structPointerCount;
  reader_01.builder.elementSize = local_1b0.elementSize;
  reader_01.builder._39_1_ = local_1b0._39_1_;
  expected_00._M_len = 3;
  expected_00._M_array = (iterator)&local_318;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_01,expected_00);
  StructBuilder::asReader(&local_348);
  bVar5 = local_354 == 0;
  local_318.field_1.value.ownFile.content.size_ = (size_t)local_360;
  if (bVar5) {
    local_318.field_1.value.ownFile.content.size_ = (size_t)(WirePointer *)0x0;
  }
  local_318.field_1._16_4_ = 0x7fffffff;
  if (!bVar5) {
    local_318.field_1._16_4_ = local_350;
  }
  local_318._0_4_ = 0;
  local_318._4_4_ = 0;
  local_318.field_1._0_4_ = 0;
  local_318.field_1._4_4_ = 0;
  if (!bVar5) {
    local_318._0_4_ = local_378._0_4_;
    local_318._4_4_ = local_378._4_4_;
    local_318.field_1._0_4_ = local_378._8_4_;
    local_318.field_1._4_4_ = uStack_36c;
  }
  PointerReader::getList(&local_130,(PointerReader *)&local_318,BYTE,(word *)0x0);
  local_318._0_3_ = 0x38220c;
  reader_02.reader.capTable = local_130.capTable;
  reader_02.reader.segment = local_130.segment;
  reader_02.reader.ptr = local_130.ptr;
  reader_02.reader.elementCount = local_130.elementCount;
  reader_02.reader.step = local_130.step;
  reader_02.reader.structDataSize = local_130.structDataSize;
  reader_02.reader.structPointerCount = local_130.structPointerCount;
  reader_02.reader.elementSize = local_130.elementSize;
  reader_02.reader._39_1_ = local_130._39_1_;
  reader_02.reader.nestingLimit = local_130.nestingLimit;
  reader_02.reader._44_4_ = local_130._44_4_;
  expected_01._M_len = 3;
  expected_01._M_array = &local_318.isSet;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_char,_(capnp::Kind)0>_>
            (reader_02,expected_01);
  bVar5 = local_354 == 0;
  local_3a8.data = local_360;
  if (bVar5) {
    local_3a8.data = (WirePointer *)0x0;
  }
  local_3a8.pointers._0_4_ = 0x7fffffff;
  if (!bVar5) {
    local_3a8.pointers._0_4_ = local_350;
  }
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  uVar9 = 0;
  if (!bVar5) {
    uVar6 = local_378._0_4_;
    uVar7 = local_378._4_4_;
    uVar8 = local_378._8_4_;
    uVar9 = uStack_36c;
  }
  local_3a8.segment = (SegmentReader *)CONCAT44(uVar7,uVar6);
  local_3a8.capTable = (CapTableReader *)CONCAT44(uVar9,uVar8);
  PointerReader::getList
            ((ListReader *)&local_318,(PointerReader *)&local_3a8,INLINE_COMPOSITE,(word *)0x0);
  if (local_318.field_1._16_4_ == 3) {
    ListReader::getStructElement(&local_3a8,(ListReader *)&local_318,0);
    if (((local_3a8.dataSize < 8) || ((char)((WireValue<uint32_t> *)local_3a8.data)->value != '\f'))
       && (kj::_::Debug::minSeverity < 3)) {
      local_3b4 = 0xc;
      ListReader::getStructElement(&local_3a8,(ListReader *)&local_318,0);
      if (local_3a8.dataSize < 8) {
        uVar1 = 0;
      }
      else {
        uVar1 = (undefined1)((WireValue<uint32_t> *)local_3a8.data)->value;
      }
      local_3ac = CONCAT31(local_3ac._1_3_,uVar1);
      kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x280,ERROR,"\"failed: expected \" \"(12u) == (l[0].getF())\", 12u, l[0].getF()",
                 (char (*) [40])"failed: expected (12u) == (l[0].getF())",&local_3b4,
                 (uchar *)&local_3ac);
    }
    ListReader::getStructElement(&local_3a8,(ListReader *)&local_318,1);
    if (((local_3a8.dataSize < 8) || ((char)((WireValue<uint32_t> *)local_3a8.data)->value != '\"'))
       && (kj::_::Debug::minSeverity < 3)) {
      local_3b4 = 0x22;
      ListReader::getStructElement(&local_3a8,(ListReader *)&local_318,1);
      if (local_3a8.dataSize < 8) {
        uVar1 = 0;
      }
      else {
        uVar1 = (undefined1)((WireValue<uint32_t> *)local_3a8.data)->value;
      }
      local_3ac = CONCAT31(local_3ac._1_3_,uVar1);
      kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x281,ERROR,"\"failed: expected \" \"(34u) == (l[1].getF())\", 34u, l[1].getF()",
                 (char (*) [40])"failed: expected (34u) == (l[1].getF())",&local_3b4,
                 (uchar *)&local_3ac);
    }
    ListReader::getStructElement(&local_3a8,(ListReader *)&local_318,2);
    if (((local_3a8.dataSize < 8) || ((char)((WireValue<uint32_t> *)local_3a8.data)->value != '8'))
       && (kj::_::Debug::minSeverity < 3)) {
      local_3b4 = 0x38;
      ListReader::getStructElement(&local_3a8,(ListReader *)&local_318,2);
      if (local_3a8.dataSize < 8) {
        uVar1 = 0;
      }
      else {
        uVar1 = (undefined1)((WireValue<uint32_t> *)local_3a8.data)->value;
      }
      local_3ac = CONCAT31(local_3ac._1_3_,uVar1);
      kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x282,ERROR,"\"failed: expected \" \"(56u) == (l[2].getF())\", 56u, l[2].getF()",
                 (char (*) [40])"failed: expected (56u) == (l[2].getF())",&local_3b4,
                 (uchar *)&local_3ac);
    }
    local_3b4 = 0x22000c;
    local_3b0 = 0x38;
    local_3a8.segment = &(local_348.segment)->super_SegmentReader;
    local_3a8.capTable = &(local_348.capTable)->super_CapTableReader;
    local_3a8.data = local_348.pointers;
    PointerBuilder::initList((ListBuilder *)&local_318,(PointerBuilder *)&local_3a8,TWO_BYTES,3);
    uVar2 = 0;
    lVar4 = 0;
    do {
      *(undefined2 *)(local_318.field_1.value.ownFile.content.size_ + (uVar2 >> 3)) =
           *(undefined2 *)((long)&local_3b4 + lVar4);
      lVar4 = lVar4 + 2;
      uVar2 = uVar2 + (uint)local_318.field_1._20_4_;
    } while (lVar4 != 6);
    local_3a8.segment = (SegmentReader *)&PTR_run_0036b6a0;
    local_3a8.capTable = (CapTableReader *)local_378;
    kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&local_318,(Runnable *)&local_3a8);
    if ((local_318.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[30],char_const(&)[33]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x28f,ERROR,
                 "\"failed: expected \" \"e != nullptr\", \"Should have thrown an exception.\"",
                 (char (*) [30])"failed: expected e != nullptr",
                 (char (*) [33])"Should have thrown an exception.");
    }
    if ((local_318.isSet & 1U) != 0) {
      kj::Exception::~Exception((Exception *)&local_318.field_1);
    }
    bVar5 = local_354 == 0;
    local_3a8.data = local_360;
    if (bVar5) {
      local_3a8.data = (WirePointer *)0x0;
    }
    local_3a8.pointers._0_4_ = 0x7fffffff;
    if (!bVar5) {
      local_3a8.pointers._0_4_ = local_350;
    }
    uVar6 = 0;
    uVar7 = 0;
    uVar8 = 0;
    uVar9 = 0;
    if (!bVar5) {
      uVar6 = local_378._0_4_;
      uVar7 = local_378._4_4_;
      uVar8 = local_378._8_4_;
      uVar9 = uStack_36c;
    }
    local_3a8.segment = (SegmentReader *)CONCAT44(uVar7,uVar6);
    local_3a8.capTable = (CapTableReader *)CONCAT44(uVar9,uVar8);
    PointerReader::getList
              ((ListReader *)&local_318,(PointerReader *)&local_3a8,INLINE_COMPOSITE,(word *)0x0);
    if (local_318.field_1._16_4_ == 3) {
      ListReader::getStructElement(&local_3a8,(ListReader *)&local_318,0);
      if (((0x1f < local_3a8.dataSize) && (((WireValue<uint32_t> *)local_3a8.data)->value != 0)) &&
         (kj::_::Debug::minSeverity < 3)) {
        local_3b4 = 0;
        uVar3 = 0;
        ListReader::getStructElement(&local_3a8,(ListReader *)&local_318,0);
        if (0x1f < local_3a8.dataSize) {
          uVar3 = ((WireValue<uint32_t> *)local_3a8.data)->value;
        }
        local_3ac = uVar3;
        kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_int>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x297,ERROR,"\"failed: expected \" \"(0u) == (l[0].getF())\", 0u, l[0].getF()",
                   (char (*) [39])"failed: expected (0u) == (l[0].getF())",&local_3b4,&local_3ac);
      }
      ListReader::getStructElement(&local_3a8,(ListReader *)&local_318,1);
      if (((0x1f < local_3a8.dataSize) && (((WireValue<uint32_t> *)local_3a8.data)->value != 0)) &&
         (kj::_::Debug::minSeverity < 3)) {
        local_3b4 = 0;
        ListReader::getStructElement(&local_3a8,(ListReader *)&local_318,1);
        local_3ac = 0;
        if (0x1f < local_3a8.dataSize) {
          local_3ac = ((WireValue<uint32_t> *)local_3a8.data)->value;
        }
        kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_int>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x298,ERROR,"\"failed: expected \" \"(0u) == (l[1].getF())\", 0u, l[1].getF()",
                   (char (*) [39])"failed: expected (0u) == (l[1].getF())",&local_3b4,&local_3ac);
      }
      ListReader::getStructElement(&local_3a8,(ListReader *)&local_318,2);
      if (((0x1f < local_3a8.dataSize) && (((WireValue<uint32_t> *)local_3a8.data)->value != 0)) &&
         (kj::_::Debug::minSeverity < 3)) {
        local_3b4 = 0;
        ListReader::getStructElement(&local_3a8,(ListReader *)&local_318,2);
        local_3ac = 0;
        if (0x1f < local_3a8.dataSize) {
          local_3ac = ((WireValue<uint32_t> *)local_3a8.data)->value;
        }
        kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_int>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x299,ERROR,"\"failed: expected \" \"(0u) == (l[2].getF())\", 0u, l[2].getF()",
                   (char (*) [39])"failed: expected (0u) == (l[2].getF())",&local_3b4,&local_3ac);
      }
      bVar5 = local_354 == 0;
      local_318.field_1.value.ownFile.content.size_ = (size_t)local_360;
      if (bVar5) {
        local_318.field_1.value.ownFile.content.size_ = (size_t)(WirePointer *)0x0;
      }
      local_318.field_1._16_4_ = 0x7fffffff;
      if (!bVar5) {
        local_318.field_1._16_4_ = local_350;
      }
      local_318.isSet = false;
      local_318._1_3_ = 0;
      local_318._4_4_ = 0;
      local_318.field_1._0_4_ = 0;
      local_318.field_1._4_4_ = 0;
      if (!bVar5) {
        local_318._0_4_ = local_378._0_4_;
        local_318._4_4_ = local_378._4_4_;
        local_318.field_1._0_4_ = local_378._8_4_;
        local_318.field_1._4_4_ = uStack_36c;
      }
      PointerReader::getList(&local_160,(PointerReader *)&local_318,TWO_BYTES,(word *)0x0);
      local_318._0_6_ = 0x380022000c;
      reader_03.reader.capTable = local_160.capTable;
      reader_03.reader.segment = local_160.segment;
      reader_03.reader.ptr = local_160.ptr;
      reader_03.reader.elementCount = local_160.elementCount;
      reader_03.reader.step = local_160.step;
      reader_03.reader.structDataSize = local_160.structDataSize;
      reader_03.reader.structPointerCount = local_160.structPointerCount;
      reader_03.reader.elementSize = local_160.elementSize;
      reader_03.reader._39_1_ = local_160._39_1_;
      reader_03.reader.nestingLimit = local_160.nestingLimit;
      reader_03.reader._44_4_ = local_160._44_4_;
      expected_02._M_len = 3;
      expected_02._M_array = (iterator)&local_318;
      checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
                (reader_03,expected_02);
      MallocMessageBuilder::~MallocMessageBuilder(&local_100);
      return;
    }
    local_3b4 = 3;
    local_3ac = local_318.field_1._16_4_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&local_3a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x294,FAILED,"(3u) == (l.size())","3u, l.size()",&local_3b4,&local_3ac);
    kj::_::Debug::Fault::fatal((Fault *)&local_3a8);
  }
  local_3b4 = 3;
  local_3ac = local_318.field_1._16_4_;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
            ((Fault *)&local_3a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
             ,0x27f,FAILED,"(3u) == (l.size())","3u, l.size()",&local_3b4,&local_3ac);
  kj::_::Debug::Fault::fatal((Fault *)&local_3a8);
}

Assistant:

TEST(Encoding, ListUpgrade) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();

  root.getAnyPointerField().setAs<List<uint16_t>>({12, 34, 56});

  checkList(root.getAnyPointerField().getAs<List<uint8_t>>(), {12, 34, 56});

  {
    auto l = root.getAnyPointerField().getAs<List<test::TestLists::Struct8>>();
    ASSERT_EQ(3u, l.size());
    EXPECT_EQ(12u, l[0].getF());
    EXPECT_EQ(34u, l[1].getF());
    EXPECT_EQ(56u, l[2].getF());
  }

  checkList(root.getAnyPointerField().getAs<List<uint16_t>>(), {12, 34, 56});

  auto reader = root.asReader();

  checkList(reader.getAnyPointerField().getAs<List<uint8_t>>(), {12, 34, 56});

  {
    auto l = reader.getAnyPointerField().getAs<List<test::TestLists::Struct8>>();
    ASSERT_EQ(3u, l.size());
    EXPECT_EQ(12u, l[0].getF());
    EXPECT_EQ(34u, l[1].getF());
    EXPECT_EQ(56u, l[2].getF());
  }

  root.getAnyPointerField().setAs<List<uint16_t>>({12, 34, 56});

  {
    kj::Maybe<kj::Exception> e = kj::runCatchingExceptions([&]() {
      reader.getAnyPointerField().getAs<List<uint32_t>>();
#if !KJ_NO_EXCEPTIONS
      ADD_FAILURE() << "Should have thrown an exception.";
#endif
    });

    KJ_EXPECT(e != nullptr, "Should have thrown an exception.");
  }

  {
    auto l = reader.getAnyPointerField().getAs<List<test::TestLists::Struct32>>();
    ASSERT_EQ(3u, l.size());

    // These should return default values because the structs aren't big enough.
    EXPECT_EQ(0u, l[0].getF());
    EXPECT_EQ(0u, l[1].getF());
    EXPECT_EQ(0u, l[2].getF());
  }

  checkList(reader.getAnyPointerField().getAs<List<uint16_t>>(), {12, 34, 56});
}